

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCTest.cpp
# Opt level: O3

void NewObjInGlobal(void)

{
  Function *prototype;
  int iVar1;
  uint uVar2;
  String *this;
  ulong uVar3;
  ulong uVar4;
  _Elt_pointer ppFVar5;
  Closure *c;
  String *local_18;
  
  iVar1 = rand();
  if (iVar1 % 100 < 0x14) {
    local_18 = (String *)luna::GC::NewTable(&g_gc,GCGen2);
    if (g_globalTable.super__Deque_base<luna::Table_*,_std::allocator<luna::Table_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur !=
        g_globalTable.super__Deque_base<luna::Table_*,_std::allocator<luna::Table_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_last + -1) {
      *g_globalTable.super__Deque_base<luna::Table_*,_std::allocator<luna::Table_*>_>._M_impl.
       super__Deque_impl_data._M_finish._M_cur = (Table *)local_18;
      g_globalTable.super__Deque_base<luna::Table_*,_std::allocator<luna::Table_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur =
           g_globalTable.super__Deque_base<luna::Table_*,_std::allocator<luna::Table_*>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur + 1;
      return;
    }
    std::deque<luna::Table*,std::allocator<luna::Table*>>::_M_push_back_aux<luna::Table*>
              ((deque<luna::Table*,std::allocator<luna::Table*>> *)&g_globalTable,
               (Table **)&local_18);
    return;
  }
  uVar2 = iVar1 % 100 + 1;
  if (uVar2 < 0x33) {
    local_18 = luna::GC::NewString(&g_gc,GCGen2);
    if (g_globalString.super__Deque_base<luna::String_*,_std::allocator<luna::String_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur !=
        g_globalString.super__Deque_base<luna::String_*,_std::allocator<luna::String_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_last + -1) {
      *g_globalString.super__Deque_base<luna::String_*,_std::allocator<luna::String_*>_>._M_impl.
       super__Deque_impl_data._M_finish._M_cur = local_18;
      g_globalString.super__Deque_base<luna::String_*,_std::allocator<luna::String_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur =
           g_globalString.super__Deque_base<luna::String_*,_std::allocator<luna::String_*>_>._M_impl
           .super__Deque_impl_data._M_finish._M_cur + 1;
      return;
    }
    std::deque<luna::String*,std::allocator<luna::String*>>::_M_push_back_aux<luna::String*>
              ((deque<luna::String*,std::allocator<luna::String*>> *)&g_globalString,&local_18);
    return;
  }
  if (0x3c < uVar2) {
    return;
  }
  if (g_globalFunction.super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur ==
      g_globalFunction.super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur) {
    return;
  }
  uVar3 = ((long)g_globalFunction.
                 super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>._M_impl.
                 super__Deque_impl_data._M_start._M_last -
           (long)g_globalFunction.
                 super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur >> 3) +
          ((long)g_globalFunction.
                 super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur -
           (long)g_globalFunction.
                 super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_first >> 3) +
          ((((ulong)((long)g_globalFunction.
                           super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>.
                           _M_impl.super__Deque_impl_data._M_finish._M_node -
                    (long)g_globalFunction.
                          super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (ulong)(g_globalFunction.
                  super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x40;
  if (uVar3 == 0) {
    uVar3 = 0;
  }
  else {
    iVar1 = rand();
    uVar3 = (ulong)(long)iVar1 % uVar3;
  }
  uVar4 = ((long)g_globalFunction.
                 super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur -
           (long)g_globalFunction.
                 super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>._M_impl.
                 super__Deque_impl_data._M_start._M_first >> 3) + uVar3;
  if ((long)uVar4 < 0) {
    uVar3 = (long)uVar4 >> 6;
  }
  else {
    if (uVar4 < 0x40) {
      ppFVar5 = g_globalFunction.
                super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur + uVar3;
      goto LAB_0010a10f;
    }
    uVar3 = uVar4 >> 6;
  }
  ppFVar5 = g_globalFunction.super__Deque_base<luna::Function_*,_std::allocator<luna::Function_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_node[uVar3] + uVar4 + uVar3 * -0x40;
LAB_0010a10f:
  prototype = *ppFVar5;
  this = (String *)luna::GC::NewClosure(&g_gc,GCGen1);
  local_18 = this;
  luna::Closure::SetPrototype((Closure *)this,prototype);
  if (g_globalClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur ==
      g_globalClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<luna::Closure*,std::allocator<luna::Closure*>>::
    _M_push_back_aux<luna::Closure*const&>
              ((deque<luna::Closure*,std::allocator<luna::Closure*>> *)&g_globalClosure,
               (Closure **)&local_18);
  }
  else {
    *g_globalClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>._M_impl.
     super__Deque_impl_data._M_finish._M_cur = (Closure *)this;
    g_globalClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>._M_impl.
    super__Deque_impl_data._M_finish._M_cur =
         g_globalClosure.super__Deque_base<luna::Closure_*,_std::allocator<luna::Closure_*>_>.
         _M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  return;
}

Assistant:

inline T RandomRange(T min, T max)
{
    return rand() % (max + 1 - min) + min;
}